

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_archive.hpp
# Opt level: O1

result_type __thiscall
pstore::serialize::archive::details::database_writer_policy::
putn<pstore::gsl::span<unsigned_long_const,2l>>
          (database_writer_policy *this,span<const_unsigned_long,_2L> sp)

{
  element_type *__result;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  pair<std::shared_ptr<unsigned_long>,_pstore::typed_address<unsigned_long>_> local_58;
  storage_type<pstore::gsl::details::extent_type<2L>_> local_40;
  span_iterator<pstore::gsl::span<const_unsigned_long,_2L>,_false> local_38;
  span_iterator<pstore::gsl::span<const_unsigned_long,_2L>,_false> local_28;
  
  local_40 = sp.storage_.data_;
  transaction_base::alloc_rw<unsigned_long,void>(&local_58,this->transaction_,2);
  this_00._M_pi =
       local_58.first.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  __result = local_58.first.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_58.first.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_58.first.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_38.span_ = (span<const_unsigned_long,_2L> *)&local_40;
  local_28.index_ = 0;
  local_38.index_ = 2;
  local_28.span_ = local_38.span_;
  std::
  copy<pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_long_const,2l>,false>,unsigned_long*>
            (&local_28,&local_38,__result);
  if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
  }
  return (result_type)(value_type)local_58.second.a_.a_;
}

Assistant:

auto putn (Span sp) -> result_type {
                        using element_type =
                            typename std::remove_const<typename Span::element_type>::type;

                        std::shared_ptr<element_type> ptr;
                        auto addr = typed_address<element_type>::null ();
                        std::tie (ptr, addr) = transaction_.template alloc_rw<element_type> (
                            unsigned_cast (sp.size ()));
                        std::copy (std::begin (sp), std::end (sp), ptr.get ());
                        return addr.to_address ();
                    }